

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O2

bool __thiscall
Inferences::FunctionDefinitionDemodulation::perform
          (FunctionDefinitionDemodulation *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  Ordering *pOVar1;
  Term *term;
  Literal *eqLit;
  Term **ppTVar2;
  Term **ppTVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  TermList rwTerm;
  DemodulationHelper *helper;
  TermList TVar10;
  Clause *pCVar11;
  TypedTermList t;
  SingletonIterator<Kernel::Clause_*> it_00;
  bool isEqTautology;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
  git;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> qr;
  SmartPtr<Indexing::ResultSubstitution> local_c0;
  SimplifyingInference2 local_b0;
  NonVariableNonTypeIterator it;
  Inference local_60;
  
  pOVar1 = (((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->_ordering)._obj
  ;
  if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::attempted
       == '\0') &&
     (iVar6 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                   ::attempted), iVar6 != 0)) {
    perform::attempted._map._timestamp = 1;
    perform::attempted._map._size = 0;
    perform::attempted._map._deleted = 0;
    perform::attempted._map._capacityIndex = 0;
    perform::attempted._map._capacity = 0;
    perform::attempted._map._20_8_ = 0;
    perform::attempted._map._28_8_ = 0;
    perform::attempted._map._afterLast._4_4_ = 0;
    __cxa_atexit(Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet,
                 &perform::attempted,&__dso_handle);
    __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                         ::attempted);
  }
  Lib::DHMap<Kernel::Term_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&perform::attempted._map);
  uVar8 = (ulong)((uint)*(undefined8 *)&cl->field_0x38 & 0xfffff);
  uVar4 = 0;
  do {
    uVar9 = uVar4;
    if (uVar9 == uVar8) break;
    term = &cl->_literals[uVar9]->super_Term;
    Kernel::NonVariableNonTypeIterator::NonVariableNonTypeIterator(&it,term,false);
    while (ppTVar3 = it._stack._cursor, ppTVar2 = it._stack._stack,
          it._stack._cursor != it._stack._stack) {
      rwTerm._content = (uint64_t)Kernel::NonVariableNonTypeIterator::next(&it);
      Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
      bVar5 = Lib::DHMap<Kernel::Term_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert(&perform::attempted._map,rwTerm._content);
      if (bVar5) {
        bVar5 = DemodulationHelper::redundancyCheckNeededForPremise
                          (&this->_helper,cl,(Literal *)term,rwTerm);
        t._sort._content = rwTerm._content;
        t.super_TermList._content =
             (uint64_t)
             ((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->_fnDefHandler;
        Shell::FunctionDefinitionHandler::getGeneralizations((FunctionDefinitionHandler *)&git,t);
        helper = (DemodulationHelper *)0x0;
        if (bVar5) {
          helper = &this->_helper;
        }
        while (iVar6 = (*(git._core)->_vptr_IteratorCore[2])(), (char)iVar6 != '\0') {
          (*(git._core)->_vptr_IteratorCore[3])(&qr);
          if ((*(uint *)&(qr.data)->clause->field_0x38 & 0xfffff) == 1) {
            TVar10 = Kernel::EqHelper::getOtherEqualitySide
                               ((qr.data)->literal,((qr.data)->term).super_TermList._content);
            uVar7 = (*pOVar1->_vptr_Ordering[3])
                              (pOVar1,TVar10._content,((qr.data)->term).super_TermList._content);
            if ((uVar7 & 0xfffffffd) != 1) {
              isEqTautology = false;
              pCVar11 = (qr.data)->clause;
              TVar10._content = ((qr.data)->term).super_TermList._content;
              eqLit = (qr.data)->literal;
              local_c0._obj = qr.unifier._obj;
              local_c0._refCnt = qr.unifier._refCnt;
              if (qr.unifier._refCnt != (RefCounter *)0x0 &&
                  qr.unifier._obj != (ResultSubstitution *)0x0) {
                (qr.unifier._refCnt)->_val = (qr.unifier._refCnt)->_val + 1;
              }
              local_b0.rule = FUNCTION_DEFINITION_DEMODULATION;
              local_b0.premise1 = cl;
              local_b0.premise2 = pCVar11;
              Kernel::Inference::Inference(&local_60,&local_b0);
              pCVar11 = performRewriting(cl,(Literal *)term,rwTerm,pCVar11,eqLit,TVar10,&local_c0,
                                         helper,&isEqTautology,&local_60);
              Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&local_c0);
              if (pCVar11 == (Clause *)0x0) {
                if ((isEqTautology & 1U) == 0) goto LAB_003f072f;
              }
              else if ((isEqTautology & 1U) == 0) {
                *replacement = pCVar11;
              }
              it_00._el = (Clause *)0x0;
              it_00._0_8_ = &local_60;
              Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it_00);
              Lib::VirtualIterator<Kernel::Clause_*>::operator=
                        (premises,(VirtualIterator<Kernel::Clause_*> *)&local_60);
              Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                        ((VirtualIterator<Kernel::Clause_*> *)&local_60);
              Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&qr.unifier);
              Lib::
              VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
              ::~VirtualIterator(&git);
              goto LAB_003f07a7;
            }
          }
LAB_003f072f:
          Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&qr.unifier);
        }
        Lib::
        VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
        ::~VirtualIterator(&git);
      }
      else {
        Kernel::NonVariableNonTypeIterator::right(&it);
      }
    }
LAB_003f07a7:
    Kernel::NonVariableNonTypeIterator::~NonVariableNonTypeIterator(&it);
    uVar4 = uVar9 + 1;
  } while (ppTVar3 == ppTVar2);
  return uVar9 != uVar8;
}

Assistant:

bool FunctionDefinitionDemodulation::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  Ordering& ordering = _salg->getOrdering();

  static DHSet<Term*> attempted;
  attempted.reset();

  unsigned cLen = cl->length();
  for (unsigned li = 0; li < cLen; li++) {
    Literal* lit = (*cl)[li];
    NonVariableNonTypeIterator it(lit);
    while (it.hasNext()) {
      TypedTermList trm = it.next();
      if (!attempted.insert(trm.term())) {
        it.right();
        continue;
      }

      bool redundancyCheck = _helper.redundancyCheckNeededForPremise(cl, lit, trm);

      auto git = _salg->getFunctionDefinitionHandler().getGeneralizations(trm);
      while (git.hasNext()) {
        auto qr = git.next();
        if (qr.data->clause->length() != 1) {
          continue;
        }
        auto rhs = EqHelper::getOtherEqualitySide(qr.data->literal, qr.data->term);
        // TODO shouldn't allow demodulation with incomparables in the non-ground case
        if (Ordering::isGreaterOrEqual(ordering.compare(rhs,qr.data->term))) {
          continue;
        }
        bool isEqTautology = false;
        auto res = performRewriting(
          cl, lit, trm, qr.data->clause, qr.data->literal, qr.data->term, qr.unifier, redundancyCheck ? &_helper : nullptr,
          isEqTautology, Inference(SimplifyingInference2(InferenceRule::FUNCTION_DEFINITION_DEMODULATION, cl, qr.data->clause)));
        if (!res && !isEqTautology) {
          continue;
        }
        if (!isEqTautology) {
          replacement = res;
        }
        premises = pvi(getSingletonIterator(qr.data->clause));
        return true;
      }
    }
  }

  return false;
}